

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O2

bool __thiscall
QtPrivate::QStringList_contains
          (QtPrivate *this,QStringList *that,QLatin1StringView str,CaseSensitivity cs)

{
  int iVar1;
  QString *string;
  QString *this_00;
  long lVar2;
  QLatin1StringView other;
  
  other.m_data = (char *)str.m_size;
  this_00 = *(QString **)(this + 8);
  for (lVar2 = *(long *)(this + 0x10) * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    if ((QStringList *)(this_00->d).size == that) {
      other.m_size = (qsizetype)that;
      iVar1 = QString::compare(this_00,other,(CaseSensitivity)str.m_data);
      if (iVar1 == 0) break;
    }
    this_00 = this_00 + 1;
  }
  return lVar2 != 0;
}

Assistant:

bool QtPrivate::QStringList_contains(const QStringList *that, QLatin1StringView str,
                                     Qt::CaseSensitivity cs)
{
    return stringList_contains(*that, str, cs);
}